

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_parser.cpp
# Opt level: O1

void __thiscall
Parser_simpleGeneratorModel_Test::~Parser_simpleGeneratorModel_Test
          (Parser_simpleGeneratorModel_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, simpleGeneratorModel)
{
    const std::string e =
        "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">\n"
        "            <apply>\n"
        "                <eq/>\n"
        "                <apply>\n"
        "                    <diff/>\n"
        "                    <bvar>\n"
        "                        <ci>time</ci>\n"
        "                    </bvar>\n"
        "                    <ci>x</ci>\n"
        "                </apply>\n"
        "                <cn cellml:units=\"per_second\">1</cn>\n"
        "            </apply>\n"
        "        </math>\n";

    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr model = p->parseModel(fileContents("analyser/initialised_variable_of_integration.cellml"));

    EXPECT_EQ(size_t(0), p->issueCount());

    std::string a = model->component("my_component")->math();
    EXPECT_EQ(e, a);
}